

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::Extractor::Extractor(Extractor *this,Net *_net,size_t blob_count)

{
  void *pvVar1;
  undefined8 *in_RDI;
  Net *in_stack_ffffffffffffffd8;
  ExtractorPrivate *in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__Extractor_01d45bb0;
  pvVar1 = operator_new(0x60);
  ExtractorPrivate::ExtractorPrivate(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  in_RDI[1] = pvVar1;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_ffffffffffffffe0,
             (size_type)in_stack_ffffffffffffffd8);
  memcpy((void *)(in_RDI[1] + 0x20),(void *)(*(long *)in_RDI[1] + 8),0x40);
  return;
}

Assistant:

Extractor::Extractor(const Net* _net, size_t blob_count)
    : d(new ExtractorPrivate(_net))
{
    d->blob_mats.resize(blob_count);
    d->opt = d->net->opt;

#if NCNN_VULKAN
    if (d->net->opt.use_vulkan_compute)
    {
        d->local_blob_vkallocator = 0;
        d->local_staging_vkallocator = 0;

        d->blob_mats_gpu.resize(blob_count);
        d->blob_mats_gpu_image.resize(blob_count);
    }
#endif // NCNN_VULKAN
}